

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::TeamCityReporter::testCaseEnded(TeamCityReporter *this,TestCaseStats *testCaseStats)

{
  StringRef str;
  StringRef str_00;
  StringRef str_01;
  StringRef str_02;
  StringRef str_03;
  ostream *poVar1;
  char *unaff_RBX;
  size_type unaff_R12;
  string asStackY_68 [32];
  string local_48 [32];
  
  (this->super_StreamingReporterBase).currentTestCaseInfo = (TestCaseInfo *)0x0;
  if ((testCaseStats->stdOut)._M_string_length != 0) {
    poVar1 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                             "##teamcity[testStdOut name=\'");
    str.m_size = unaff_R12;
    str.m_start = unaff_RBX;
    (anonymous_namespace)::escape_abi_cxx11_(str);
    poVar1 = std::operator<<(poVar1,asStackY_68);
    poVar1 = std::operator<<(poVar1,"\' out=\'");
    str_00.m_size = unaff_R12;
    str_00.m_start = unaff_RBX;
    (anonymous_namespace)::escape_abi_cxx11_(str_00);
    poVar1 = std::operator<<(poVar1,local_48);
    std::operator<<(poVar1,"\']\n");
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string(asStackY_68);
  }
  if ((testCaseStats->stdErr)._M_string_length != 0) {
    poVar1 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                             "##teamcity[testStdErr name=\'");
    str_01.m_size = unaff_R12;
    str_01.m_start = unaff_RBX;
    (anonymous_namespace)::escape_abi_cxx11_(str_01);
    poVar1 = std::operator<<(poVar1,asStackY_68);
    poVar1 = std::operator<<(poVar1,"\' out=\'");
    str_02.m_size = unaff_R12;
    str_02.m_start = unaff_RBX;
    (anonymous_namespace)::escape_abi_cxx11_(str_02);
    poVar1 = std::operator<<(poVar1,local_48);
    std::operator<<(poVar1,"\']\n");
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string(asStackY_68);
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                           "##teamcity[testFinished name=\'");
  str_03.m_size = unaff_R12;
  str_03.m_start = unaff_RBX;
  (anonymous_namespace)::escape_abi_cxx11_(str_03);
  poVar1 = std::operator<<(poVar1,asStackY_68);
  poVar1 = std::operator<<(poVar1,"\' duration=\'");
  Timer::getElapsedMilliseconds(&this->m_testTimer);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\']\n");
  std::__cxx11::string::~string(asStackY_68);
  std::ostream::flush();
  return;
}

Assistant:

void TeamCityReporter::testCaseEnded(TestCaseStats const& testCaseStats) {
        StreamingReporterBase::testCaseEnded(testCaseStats);
        auto const& testCaseInfo = *testCaseStats.testInfo;
        if (!testCaseStats.stdOut.empty())
            m_stream << "##teamcity[testStdOut name='"
            << escape(testCaseInfo.name)
            << "' out='" << escape(testCaseStats.stdOut) << "']\n";
        if (!testCaseStats.stdErr.empty())
            m_stream << "##teamcity[testStdErr name='"
            << escape(testCaseInfo.name)
            << "' out='" << escape(testCaseStats.stdErr) << "']\n";
        m_stream << "##teamcity[testFinished name='"
            << escape(testCaseInfo.name) << "' duration='"
            << m_testTimer.getElapsedMilliseconds() << "']\n";
        m_stream.flush();
    }